

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int Catch::Main(Config *configWrapper)

{
  What WVar1;
  int iVar2;
  int iVar3;
  Runner2 runner;
  Totals local_280;
  undefined1 local_260 [264];
  ios_base local_158 [264];
  Ptr<Catch::IReporter> local_50;
  _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
  local_48;
  
  Runner2::Runner2((Runner2 *)local_260,configWrapper);
  WVar1 = (configWrapper->m_data).listSpec;
  if (WVar1 == None) {
    Runner2::runTests(&local_280,(Runner2 *)local_260);
    iVar3 = (int)local_280.assertions.failed;
  }
  else {
    List(&configWrapper->m_data);
    cleanUp();
    iVar3 = 0;
  }
  std::
  _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
  ::~_Rb_tree(&local_48);
  if (local_50.m_p != (IReporter *)0x0) {
    (*((local_50.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  local_260._16_8_ = _VTT;
  *(undefined8 *)(local_260 + *(long *)(_VTT + -0x18) + 0x10) = _setbuf;
  std::filebuf::~filebuf((filebuf *)(local_260 + 0x18));
  std::ios_base::~ios_base(local_158);
  iVar2 = 0;
  if (WVar1 == None) {
    cleanUp();
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

inline int Main( Config& configWrapper ) {
        int result = 0;
        try
        {
            Runner2 runner( configWrapper );

            const ConfigData& config = configWrapper.data();

            // Handle list request
            if( config.listSpec != List::None ) {
                List( config );
                Catch::cleanUp();
                return 0;
            }

            result = static_cast<int>( runner.runTests().assertions.failed );

        }
        catch( std::exception& ex ) {
            std::cerr << ex.what() << std::endl;
            result = (std::numeric_limits<int>::max)();
        }

        Catch::cleanUp();
        return result;
    }